

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionEvaluation.hpp
# Opt level: O1

Option<Kernel::PolyNf> * __thiscall
Inferences::simplFloor<Kernel::NumTraits<Kernel::RealConstantType>>
          (Option<Kernel::PolyNf> *__return_storage_ptr__,Inferences *this,PolyNf *evalArgs)

{
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar1;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar2;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar3;
  Self SVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  RealConstantType *pRVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Db_01;
  FuncId FVar11;
  FuncId f;
  anon_class_16_2_f84bbffd f_00;
  anon_class_16_2_20c48a23 f_01;
  Numeral i;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> monom;
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  pulledOut;
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  keptIn;
  Numeral k;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  poly;
  Option<Kernel::RealConstantType> inner;
  int local_464;
  RealConstantType local_460;
  OptionBase<Kernel::PolyNf> *local_440;
  _Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&>
  local_438;
  Value VStack_430;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_410;
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_400;
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_3f0;
  long local_3e0;
  ulong local_3d8;
  undefined1 local_3d0 [16];
  RealConstantType local_3c0;
  undefined1 local_3a0 [16];
  int local_390;
  mp_limb_t *local_388;
  uint local_380 [2];
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_378;
  undefined4 local_370 [4];
  RealConstantType local_360;
  uint local_340;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_338;
  RealConstantType local_330;
  uint local_310;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_308;
  RealConstantType local_300;
  uint local_2e0;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_2d8;
  undefined1 local_2d0 [24];
  undefined8 *local_2b8;
  RealConstantType local_2a0;
  RealConstantType local_280;
  RealConstantType local_260;
  RealConstantType local_240;
  RealConstantType local_220;
  RealConstantType local_200;
  RealConstantType local_1e0;
  RealConstantType local_1c0;
  RealConstantType local_1a0;
  uint local_180;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_178;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_170;
  Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> local_150;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_140;
  undefined1 local_120 [32];
  long local_100;
  undefined8 *local_f8;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> local_e0;
  OptionBase<Kernel::RealConstantType> local_b0;
  PolyNf local_88;
  AnyPoly local_68;
  AnyPoly local_48;
  
  local_438.
  super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&,_false>
  ._M_head_impl =
       (_Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&,_false>
        )local_2d0;
  VStack_430._0_8_ = &local_3c0;
  VStack_430.init.super_RationalConstantType._num._val[0]._mp_d = (mp_limb_t *)&local_460;
  f_01.this = (Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               *)this;
  f_01.fs_ = (tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:921:7)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:922:7)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&>
              *)&local_438;
  local_440 = &__return_storage_ptr__->super_OptionBase<Kernel::PolyNf>;
  ::Lib::CoproductImpl::
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  ::
  switchN<Lib::Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>::match<Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::Variable)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::AnyPoly)_1_>(Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::Variable)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::AnyPoly)_1_)const&::_lambda(auto:1)_1_>
            ((ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict27
              *)&local_b0,
             (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
              *)this,f_01);
  if (local_b0._isSome == true) {
    Kernel::RationalConstantType::floor
              ((RationalConstantType *)local_3a0,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)
              );
    Kernel::RealConstantType::RealConstantType(&local_1c0,(IntegerConstantType *)local_3a0);
    Kernel::PolyNf::fromNumeral<Kernel::RealConstantType>((PolyNf *)&local_438,&local_1c0);
    ::Lib::OptionBase<Kernel::PolyNf>::OptionBase(local_440,(PolyNf *)&local_438);
    mpz_clear(local_1c0.super_RationalConstantType._den._val);
    mpz_clear((__mpz_struct *)&local_1c0);
    mpz_clear((__mpz_struct *)local_3a0);
    goto LAB_005119f3;
  }
  Kernel::PolyNf::wrapPoly<Kernel::NumTraits<Kernel::RealConstantType>>((PolyNf *)local_2d0);
  ::Lib::
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_400);
  ::Lib::
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_3f0);
  pRVar8 = *(RealConstantType **)(local_2d0._8_8_ + 8);
  local_3e0 = local_2d0._8_8_;
  lVar7 = (long)*(RealConstantType **)(local_2d0._8_8_ + 0x10) - (long)pRVar8;
  if (pRVar8 != (RealConstantType *)0x0 && lVar7 != 0) {
    local_3d8 = (lVar7 >> 4) * -0x5555555555555555;
    uVar6 = (ulong)(*(RealConstantType **)(local_2d0._8_8_ + 0x10) != pRVar8);
    do {
      Kernel::RealConstantType::RealConstantType((RealConstantType *)&local_438,pRVar8);
      VStack_430._24_4_ = pRVar8[1].super_RationalConstantType._num._val[0]._mp_alloc;
      local_410 = (MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                  pRVar8[1].super_RationalConstantType._num._val[0]._mp_d;
      Kernel::RealConstantType::RealConstantType(&local_3c0,(RealConstantType *)&local_438);
      pMVar2 = local_410;
      uVar9 = VStack_430._24_4_;
      local_460.super_RationalConstantType._den._val[0]._mp_d =
           (mp_limb_t *)
           (((long)(local_410->_factors)._cursor - (long)(local_410->_factors)._stack >> 2) *
           0x6db6db6db6db6db7);
      local_460.super_RationalConstantType._num._val[0]._mp_d = (mp_limb_t *)0x0;
      local_460.super_RationalConstantType._den._val[0]._mp_alloc = 0;
      local_460.super_RationalConstantType._den._val[0]._mp_size = 0;
      local_460.super_RationalConstantType._num._val[0]._0_8_ = local_410;
      bVar5 = ::Lib::
              IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>const&>>
              ::
              all<Inferences::isInteger<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>const&)::_lambda(auto:1_const&)_1_>
                        ((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::_lambda(auto:1)_1_,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>const&>>
                          *)&local_460);
      SVar4._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
      .
      super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>,_true,_true>
              )local_3f0._self;
      if (bVar5) {
        Kernel::RationalConstantType::floor
                  ((RationalConstantType *)local_120,
                   (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        Kernel::RealConstantType::RealConstantType(&local_460,(IntegerConstantType *)local_120);
        mpz_clear((__mpz_struct *)local_120);
        Kernel::RealConstantType::RealConstantType(&local_1e0,&local_460);
        local_464 = 0;
        bVar5 = Kernel::operator!=(&local_1e0,&local_464);
        mpz_clear(local_1e0.super_RationalConstantType._den._val);
        mpz_clear((__mpz_struct *)&local_1e0);
        SVar4._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
        .
        super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>,_true,_true>
                )local_400._self;
        if (bVar5) {
          Kernel::RealConstantType::RealConstantType(&local_200,&local_460);
          Kernel::RealConstantType::RealConstantType(&local_300,&local_200);
          local_2e0 = uVar9;
          local_2d8 = pMVar2;
          if (*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
               ((long)SVar4._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                      .
                      super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                      ._M_head_impl + 0x10) ==
              *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
               ((long)SVar4._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                      .
                      super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                      ._M_head_impl + 0x18)) {
            ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::expand
                      ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                       SVar4._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                       ._M_head_impl);
          }
          pMVar1 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                    ((long)SVar4._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                           ._M_head_impl + 0x10);
          Kernel::RealConstantType::RealConstantType(&pMVar1->numeral,&local_300);
          (pMVar1->factors)._id = local_2e0;
          (pMVar1->factors)._ptr = local_2d8;
          *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
           ((long)SVar4._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  .
                  super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                  ._M_head_impl + 0x10) =
               *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                ((long)SVar4._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                       ._M_head_impl + 0x10) + 1;
          mpz_clear(local_300.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_300);
          mpz_clear(local_200.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_200);
        }
        Kernel::RealConstantType::operator-(&local_220,&local_3c0,&local_460);
        local_464 = 0;
        bVar5 = Kernel::operator!=(&local_220,&local_464);
        mpz_clear(local_220.super_RationalConstantType._den._val);
        mpz_clear((__mpz_struct *)&local_220);
        SVar4._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
        .
        super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>,_true,_true>
                )local_3f0._self;
        if (bVar5) {
          Kernel::RealConstantType::operator-(&local_240,&local_3c0,&local_460);
          Kernel::RealConstantType::RealConstantType(&local_330,&local_240);
          local_310 = uVar9;
          local_308 = pMVar2;
          if (*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
               ((long)SVar4._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                      .
                      super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                      ._M_head_impl + 0x10) ==
              *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
               ((long)SVar4._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                      .
                      super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                      ._M_head_impl + 0x18)) {
            ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::expand
                      ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                       SVar4._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                       ._M_head_impl);
          }
          pMVar1 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                    ((long)SVar4._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                           ._M_head_impl + 0x10);
          Kernel::RealConstantType::RealConstantType(&pMVar1->numeral,&local_330);
          (pMVar1->factors)._id = local_310;
          (pMVar1->factors)._ptr = local_308;
          *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
           ((long)SVar4._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  .
                  super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                  ._M_head_impl + 0x10) =
               *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                ((long)SVar4._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                       ._M_head_impl + 0x10) + 1;
          mpz_clear(local_330.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_330);
          mpz_clear(local_240.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_240);
        }
        mpz_clear(local_460.super_RationalConstantType._den._val);
        mpz_clear((__mpz_struct *)&local_460);
      }
      else {
        Kernel::RealConstantType::RealConstantType(&local_360,(RealConstantType *)&local_438);
        local_340 = VStack_430._24_4_;
        local_338 = local_410;
        if (*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
             ((long)SVar4._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                    .
                    super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                    ._M_head_impl + 0x10) ==
            *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
             ((long)SVar4._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                    .
                    super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                    ._M_head_impl + 0x18)) {
          ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::expand
                    ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                     SVar4._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                     ._M_head_impl);
        }
        pMVar1 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                  ((long)SVar4._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         .
                         super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                         ._M_head_impl + 0x10);
        Kernel::RealConstantType::RealConstantType(&pMVar1->numeral,&local_360);
        (pMVar1->factors)._id = local_340;
        (pMVar1->factors)._ptr = local_338;
        *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
         ((long)SVar4._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                ._M_head_impl + 0x10) =
             *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
              ((long)SVar4._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                     ._M_head_impl + 0x10) + 1;
        mpz_clear(local_360.super_RationalConstantType._den._val);
        mpz_clear((__mpz_struct *)&local_360);
      }
      mpz_clear(local_3c0.super_RationalConstantType._den._val);
      mpz_clear((__mpz_struct *)&local_3c0);
      mpz_clear((__mpz_struct *)((long)&VStack_430 + 8));
      mpz_clear((__mpz_struct *)&local_438);
      if (uVar6 < local_3d8) {
        pRVar8 = (RealConstantType *)(uVar6 * 0x30 + *(long *)(local_3e0 + 8));
        uVar6 = uVar6 + 1;
      }
      else {
        pRVar8 = (RealConstantType *)0x0;
      }
    } while (pRVar8 != (RealConstantType *)0x0);
  }
  if (*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
       ((long)local_400._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
              .
              super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
              ._M_head_impl + 0x10) ==
      *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
       ((long)local_400._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
              .
              super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
              ._M_head_impl + 8)) {
    *(undefined8 *)((long)&(local_440->_elem)._elem + 8) = 0;
    *(undefined8 *)((long)&(local_440->_elem)._elem + 0x10) = 0;
    *(undefined8 *)local_440 = 0;
    *(undefined8 *)((long)&(local_440->_elem)._elem + 4) = 0;
  }
  else {
    lVar7 = ((long)*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                    ((long)local_3f0._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                           ._M_head_impl + 0x10) -
             (long)*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                    ((long)local_3f0._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                           ._M_head_impl + 8) >> 4) * -0x5555555555555555;
    if (lVar7 != 0) {
      if (lVar7 == 1) {
        bVar5 = Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::isNumeral
                          (*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                            ((long)local_3f0._self._M_t.
                                   super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                   .
                                   super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                                   ._M_head_impl + 8));
        if (bVar5) {
          pMVar2 = ((*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                      ((long)local_3f0._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             .
                             super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                             ._M_head_impl + 8))->factors)._ptr;
          if ((pMVar2->_factors)._stack == (pMVar2->_factors)._cursor) {
            ::Lib::OptionBase<Kernel::RealConstantType>::OptionBase
                      ((OptionBase<Kernel::RealConstantType> *)&local_438,
                       &(*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                          ((long)local_3f0._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                 .
                                 super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                                 ._M_head_impl + 8))->numeral);
            uVar9 = extraout_XMM0_Da_01;
            uVar10 = extraout_XMM0_Db_01;
          }
          else {
            uVar9 = 0;
            uVar10 = 0;
            VStack_430.init.super_RationalConstantType._num._val[0]._mp_d = (mp_limb_t *)0x0;
            VStack_430._16_8_ = (mp_limb_t *)0x0;
            local_438.
            super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&,_false>
            ._M_head_impl =
                 (_Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&,_false>
                  )(anon_class_1_0_00000001 *)0x0;
            VStack_430._0_8_ = (anon_class_1_0_00000001 *)0x0;
            VStack_430.init.super_RationalConstantType._den._val[0]._mp_d = (mp_limb_t *)0x0;
          }
          Kernel::RationalConstantType::floor
                    ((RationalConstantType *)local_3d0,(double)CONCAT44(uVar10,uVar9));
          Kernel::RealConstantType::RealConstantType(&local_460,(IntegerConstantType *)local_3d0);
          mpz_clear((__mpz_struct *)local_3d0);
          ::Lib::OptionBase<Kernel::RealConstantType>::~OptionBase
                    ((OptionBase<Kernel::RealConstantType> *)&local_438);
          Kernel::RealConstantType::RealConstantType(&local_260,&local_460);
          local_438.
          super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&,_false>
          ._M_head_impl =
               (_Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&,_false>
                )((ulong)local_438.
                         super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:923:7)_&,_false>
                         ._M_head_impl & 0xffffffff00000000);
          bVar5 = Kernel::operator!=(&local_260,(int *)&local_438);
          mpz_clear(local_260.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_260);
          SVar4._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
          .
          super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
          ._M_head_impl =
               local_400._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
               .
               super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
               ._M_head_impl;
          if (bVar5) {
            Kernel::RealConstantType::RealConstantType(&local_280,&local_460);
            Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom(&local_e0,&local_280)
            ;
            if (*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                 ((long)SVar4._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                        ._M_head_impl + 0x10) ==
                *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                 ((long)SVar4._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                        ._M_head_impl + 0x18)) {
              ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::expand
                        ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                         SVar4._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         .
                         super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                         ._M_head_impl);
            }
            pMVar1 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                      ((long)SVar4._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             .
                             super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                             ._M_head_impl + 0x10);
            Kernel::RealConstantType::RealConstantType(&pMVar1->numeral,&local_e0.numeral);
            (pMVar1->factors)._id = local_e0.factors._id;
            (pMVar1->factors)._ptr = local_e0.factors._ptr;
            *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
             ((long)SVar4._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                    .
                    super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                    ._M_head_impl + 0x10) =
                 *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                  ((long)SVar4._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         .
                         super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                         ._M_head_impl + 0x10) + 1;
            mpz_clear(local_e0.numeral.super_RationalConstantType._den._val);
            mpz_clear((__mpz_struct *)&local_e0);
            mpz_clear(local_280.super_RationalConstantType._den._val);
            mpz_clear((__mpz_struct *)&local_280);
          }
          mpz_clear(local_460.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_460);
          goto LAB_00511917;
        }
      }
      Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
                ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_140,
                 (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                 local_3f0._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                 .
                 super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                 ._M_head_impl);
      ::Lib::
      perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
                ((Lib *)local_370,
                 (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_140);
      local_48.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[7] = '\0';
      local_48.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content._0_4_ = local_370[0];
      local_48.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._0_1_ = 2;
      local_48.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content._4_3_ = 0;
      local_48.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content._8_7_ = SUB87(local_370._8_8_,0);
      local_48.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[0xf] = SUB81(local_370._8_8_,7);
      local_48.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._17_3_ = 0;
      Kernel::PolyNf::PolyNf((PolyNf *)&local_438,&local_48);
      ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_140)
      ;
      FVar11 = Kernel::FuncId::fromInterpretation(REAL_FLOOR);
      f._typeArgs = FVar11._typeArgs;
      f._4_4_ = 0;
      f._num = FVar11._num;
      Kernel::FuncTerm::FuncTerm((FuncTerm *)(local_120 + 0x10),f,(PolyNf *)&local_438);
      ::Lib::perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>
                ((Lib *)&local_150,(FuncTerm *)(local_120 + 0x10));
      Kernel::PolyNf::PolyNf((PolyNf *)&local_460,&local_150);
      if (local_f8 != (undefined8 *)0x0) {
        uVar6 = local_100 * 0x18 + 0xfU & 0xfffffffffffffff0;
        if (uVar6 == 0) {
          *local_f8 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_f8;
        }
        else if (uVar6 < 0x11) {
          *local_f8 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_f8;
        }
        else if (uVar6 < 0x19) {
          *local_f8 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_f8;
        }
        else if (uVar6 < 0x21) {
          *local_f8 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_f8;
        }
        else if (uVar6 < 0x31) {
          *local_f8 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_f8;
        }
        else if (uVar6 < 0x41) {
          *local_f8 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_f8;
        }
        else {
          operator_delete(local_f8,0x10);
        }
      }
      SVar4._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
      .
      super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
      ._M_head_impl =
           local_400._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
           .
           super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
           ._M_head_impl;
      Kernel::RealConstantType::RealConstantType(&local_2a0,1);
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[7] = '\0';
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[8] = '\0';
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[9] = '\0';
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[10] = '\0';
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0xb] = '\0';
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0xc] = '\0';
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0xd] = '\0';
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0xe] = '\0';
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0xf] = '\0';
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0x10] = '\0';
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0x11] = '\0';
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0x12] = '\0';
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content[0x13] = '\0';
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._21_3_ = 0;
      local_88.super_PolyNfSuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._0_8_ = local_460.super_RationalConstantType._num._val[0]._0_8_ & 3;
      f_00.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                    *)&local_460;
      f_00.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                   *)&local_88;
      ::Lib::CoproductImpl::
      RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
      ::
      switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                  *)&local_88,f_00);
      Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomFactors
                ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)(local_2d0 + 0x10),
                 &local_88);
      ::Lib::
      perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
                ((Lib *)local_380,
                 (MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)(local_2d0 + 0x10));
      Kernel::RealConstantType::RealConstantType(&local_1a0,&local_2a0);
      local_180 = local_380[0];
      local_178 = local_378;
      if (*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
           ((long)SVar4._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  .
                  super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                  ._M_head_impl + 0x10) ==
          *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
           ((long)SVar4._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                  .
                  super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                  ._M_head_impl + 0x18)) {
        ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::expand
                  ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                   SVar4._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                   .
                   super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                   ._M_head_impl);
      }
      pMVar1 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                ((long)SVar4._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                       ._M_head_impl + 0x10);
      Kernel::RealConstantType::RealConstantType(&pMVar1->numeral,&local_1a0);
      (pMVar1->factors)._id = local_180;
      (pMVar1->factors)._ptr = local_178;
      *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
       ((long)SVar4._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
              .
              super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
              ._M_head_impl + 0x10) =
           *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
            ((long)SVar4._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                   .
                   super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                   ._M_head_impl + 0x10) + 1;
      mpz_clear(local_1a0.super_RationalConstantType._den._val);
      mpz_clear((__mpz_struct *)&local_1a0);
      if (local_2b8 != (undefined8 *)0x0) {
        uVar6 = local_2d0._16_8_ * 0x1c + 0xfU & 0xfffffffffffffff0;
        if (uVar6 == 0) {
          *local_2b8 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_2b8;
        }
        else if (uVar6 < 0x11) {
          *local_2b8 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_2b8;
        }
        else if (uVar6 < 0x19) {
          *local_2b8 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_2b8;
        }
        else if (uVar6 < 0x21) {
          *local_2b8 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_2b8;
        }
        else if (uVar6 < 0x31) {
          *local_2b8 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_2b8;
        }
        else if (uVar6 < 0x41) {
          *local_2b8 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_2b8;
        }
        else {
          operator_delete(local_2b8,0x10);
        }
      }
      mpz_clear(local_2a0.super_RationalConstantType._den._val);
      mpz_clear((__mpz_struct *)&local_2a0);
    }
LAB_00511917:
    pMVar1 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
              ((long)local_400._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                     ._M_head_impl + 8);
    pMVar3 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
              ((long)local_400._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                     ._M_head_impl + 0x10);
    if (pMVar1 != pMVar3) {
      uVar6 = ((long)pMVar3 - (long)pMVar1 >> 4) * -0x5555555555555555;
      lVar7 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      std::
      __introsort_loop<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pMVar1,pMVar3,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>*,__gnu_cxx::__ops::_Iter_less_iter>
                (pMVar1,pMVar3);
    }
    Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_170,
               (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
               local_400._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
               .
               super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
               ._M_head_impl);
    ::Lib::
    perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
              ((Lib *)&local_390,(Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_170
              );
    local_68.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content[7] = '\0';
    local_68.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content._0_4_ = local_390;
    local_68.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._0_1_ = 2;
    local_68.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content._4_3_ = 0;
    local_68.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content._8_7_ = SUB87(local_388,0);
    local_68.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content[0xf] = (char)((ulong)local_388 >> 0x38);
    local_68.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._17_3_ = 0;
    Kernel::PolyNf::PolyNf((PolyNf *)&local_438,&local_68);
    ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_170);
    ::Lib::OptionBase<Kernel::PolyNf>::OptionBase(local_440,(PolyNf *)&local_438);
  }
  ::Lib::
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_3f0);
  ::Lib::
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_400);
LAB_005119f3:
  ::Lib::OptionBase<Kernel::RealConstantType>::~OptionBase(&local_b0);
  return (Option<Kernel::PolyNf> *)local_440;
}

Assistant:

inline Option<PolyNf> simplFloor(PolyNf* evalArgs)
{
  using Numeral = typename NumTraits::ConstantType;
  auto inner = evalArgs[0].tryNumeral<NumTraits>();
  if (inner) {
    return some(PolyNf::fromNumeral(Numeral(inner->floor())));
  }  else {
    auto poly = evalArgs[0].wrapPoly<NumTraits>();
    // floor(s1 + ... + sn + t1 + ... + tm) ===> s1 + ... + sn + floor(t1 + ... + tn)
    //                              pulledOut <--^^^^^^^^^^^^^         ^^^^^^^^^^^^^--> keptIn
    Recycled<Stack<Monom<NumTraits>>> pulledOut;
    Recycled<Stack<Monom<NumTraits>>> keptIn;
    for (auto monom : poly->iterSummands()) {
      auto k = monom.numeral;
      auto t = monom.factors;
      if (isInteger(*t)) {
        // floor(t + k t) ==> floor(t + (k - i) t) + i t
        //   where t is an integer and
        //         i = floor(k)
        auto i = Numeral(k.floor());
        if (i       != 0) { pulledOut->push(Monom(i   , t)); }
        if ((k - i) != 0) { keptIn->   push(Monom(k -i, t)); }
      } else {
        keptIn->push(monom);
      }
    }

    if (pulledOut->size() == 0) {
      return {};

    } else {


      if (keptIn->size() == 0) {

      } else if (keptIn->size() == 1 && (*keptIn)[0].isNumeral()) { 
        auto numFloor = Numeral((*keptIn)[0].tryNumeral()->floor());
        if (numFloor != 0)
          pulledOut->push(Monom<NumTraits>(numFloor));
      } else {
        auto innerSum = PolyNf(AnyPoly(perfect(Polynom<NumTraits>(std::move(*keptIn)))));
        auto floorTerm = PolyNf(perfect(FuncTerm(FuncId::fromInterpretation(NumTraits::floorI), &innerSum)));
        pulledOut->push(Monom<NumTraits>(Numeral(1), perfect(MonomFactors<NumTraits>(floorTerm))));
      }


      std::sort(pulledOut->begin(), pulledOut->end());

      auto out = PolyNf(AnyPoly(perfect(Polynom<NumTraits>(std::move(*pulledOut)))));
      return some(out);
    }
  }
}